

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

uint16_t basist::dxt1_block::pack_color(color32 *color,bool scaled,uint32_t bias)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  uint uVar6;
  uint uVar7;
  
  bVar1 = (color->field_0).field_0.r;
  uVar6 = (uint)bVar1;
  bVar2 = (color->field_0).field_0.g;
  uVar7 = (uint)bVar2;
  bVar3 = (color->field_0).field_0.b;
  uVar4 = (uint)bVar3;
  if ((int)CONCAT71(in_register_00000031,scaled) != 0) {
    uVar6 = ((uint)bVar1 * 0x1f + bias) / 0xff;
    uVar7 = ((uint)bVar2 * 0x3f + bias) / 0xff;
    uVar4 = ((uint)bVar3 * 0x1f + bias) / 0xff;
  }
  if (0x1e < uVar4) {
    uVar4 = 0x1f;
  }
  uVar5 = 0x3f;
  if (uVar7 < 0x3f) {
    uVar5 = uVar7;
  }
  uVar7 = 0x1f;
  if (uVar6 < 0x1f) {
    uVar7 = uVar6;
  }
  return (ushort)(uVar7 << 0xb) | (ushort)(uVar5 << 5) | (ushort)uVar4;
}

Assistant:

static uint16_t pack_color(const color32& color, bool scaled, uint32_t bias = 127U)
		{
			uint32_t r = color.r, g = color.g, b = color.b;
			if (scaled)
			{
				r = (r * 31U + bias) / 255U;
				g = (g * 63U + bias) / 255U;
				b = (b * 31U + bias) / 255U;
			}
			return static_cast<uint16_t>(basisu::minimum(b, 31U) | (basisu::minimum(g, 63U) << 5U) | (basisu::minimum(r, 31U) << 11U));
		}